

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O3

void __thiscall
PluginFverb::runSegmented(PluginFverb *this,float **inputs,float **outputs,uint32_t frames)

{
  pointer __dest;
  float *pfVar1;
  float *pfVar2;
  uint32_t frames_00;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  uint __n2;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float *offsetOutputs [2];
  float *offsetInputs [2];
  long local_70;
  long local_68;
  ulong local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  size_t local_38;
  
  local_60 = (ulong)frames;
  local_38 = local_60 * 4;
  plVar6 = &local_68;
  lVar5 = 0;
  uVar8 = 0;
  bVar4 = true;
  do {
    while( true ) {
      bVar3 = bVar4;
      __dest = this->fInputKeep[lVar5].super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      *plVar6 = (long)__dest;
      if (frames != 0) break;
      lVar5 = 1;
      plVar6 = &local_70;
      bVar4 = false;
      if (!bVar3) goto LAB_0010a670;
    }
    memmove(__dest,inputs[lVar5],local_38);
    lVar5 = 1;
    plVar6 = &local_70;
    bVar4 = false;
  } while (bVar3);
  do {
    local_48 = *inputs + uVar8;
    local_40 = inputs[1] + uVar8;
    local_58 = *outputs + uVar8;
    local_50 = outputs[1] + uVar8;
    frames_00 = frames - uVar8;
    if (0xff < frames - uVar8) {
      frames_00 = 0x100;
    }
    if (this->fVintage == false) {
      runAtNormalRate(this,&local_48,&local_58,frames_00);
    }
    else {
      runDownsampled(this,&local_48,&local_58,frames_00);
    }
    uVar8 = uVar8 + frames_00;
  } while (uVar8 < frames);
LAB_0010a670:
  fVar13 = (this->fWet).mem;
  pfVar1 = &(this->fWet).target;
  if ((fVar13 != *pfVar1) || (NAN(fVar13) || NAN(*pfVar1))) {
    if (frames != 0) {
      pfVar1 = *outputs;
      pfVar2 = outputs[1];
      uVar7 = 0;
      do {
        fVar13 = (this->fWet).mem;
        fVar9 = (this->fWet).target - fVar13;
        fVar10 = ABS(fVar9);
        fVar11 = ABS((this->fWet).step);
        fVar12 = fVar11;
        if (fVar10 <= fVar11) {
          fVar12 = fVar10;
        }
        fVar13 = (float)(~-(uint)NAN(fVar10) & (uint)fVar12 | -(uint)NAN(fVar10) & (uint)fVar11 |
                        (uint)fVar9 & 0x80000000) + fVar13;
        (this->fWet).mem = fVar13;
        pfVar1[uVar7] = pfVar1[uVar7] * fVar13;
        pfVar2[uVar7] = fVar13 * pfVar2[uVar7];
        uVar7 = uVar7 + 1;
      } while (local_60 != uVar7);
    }
  }
  else if (frames != 0) {
    pfVar1 = *outputs;
    pfVar2 = outputs[1];
    uVar7 = 0;
    do {
      pfVar1[uVar7] = pfVar1[uVar7] * fVar13;
      pfVar2[uVar7] = pfVar2[uVar7] * fVar13;
      uVar7 = uVar7 + 1;
    } while (local_60 != uVar7);
  }
  fVar13 = (this->fDry).mem;
  pfVar1 = &(this->fDry).target;
  if ((fVar13 != *pfVar1) || (NAN(fVar13) || NAN(*pfVar1))) {
    if (frames != 0) {
      pfVar1 = *outputs;
      pfVar2 = outputs[1];
      uVar7 = 0;
      do {
        fVar13 = (this->fDry).mem;
        fVar9 = (this->fDry).target - fVar13;
        fVar10 = ABS(fVar9);
        fVar11 = ABS((this->fDry).step);
        fVar12 = fVar11;
        if (fVar10 <= fVar11) {
          fVar12 = fVar10;
        }
        fVar13 = (float)(~-(uint)NAN(fVar10) & (uint)fVar12 | -(uint)NAN(fVar10) & (uint)fVar11 |
                        (uint)fVar9 & 0x80000000) + fVar13;
        (this->fDry).mem = fVar13;
        pfVar1[uVar7] = *(float *)(local_68 + uVar7 * 4) * fVar13 + pfVar1[uVar7];
        pfVar2[uVar7] = fVar13 * *(float *)(local_70 + uVar7 * 4) + pfVar2[uVar7];
        uVar7 = uVar7 + 1;
      } while (local_60 != uVar7);
    }
  }
  else if (frames != 0) {
    pfVar1 = *outputs;
    pfVar2 = outputs[1];
    uVar7 = 0;
    do {
      pfVar1[uVar7] = *(float *)(local_68 + uVar7 * 4) * fVar13 + pfVar1[uVar7];
      pfVar2[uVar7] = *(float *)(local_70 + uVar7 * 4) * fVar13 + pfVar2[uVar7];
      uVar7 = uVar7 + 1;
    } while (local_60 != uVar7);
  }
  return;
}

Assistant:

void PluginFverb::runSegmented(const float **inputs, float **outputs, uint32_t frames)
{
    float *inputKeep[kNumChannels];
    for (uint32_t ch = 0; ch < kNumChannels; ++ch) {
        inputKeep[ch] = fInputKeep[ch].data();
        std::copy_n(inputs[ch], frames, inputKeep[ch]);
    }

    uint32_t index = 0;
    while (index < frames) {
        uint32_t bs = frames - index;
        if (bs > kMaxResampledBlock)
            bs = kMaxResampledBlock;

        const float *offsetInputs[kNumChannels];
        float *offsetOutputs[kNumChannels];
        for (uint32_t ch = 0; ch < kNumChannels; ++ch)
            offsetInputs[ch] = inputs[ch] + index;
        for (uint32_t ch = 0; ch < kNumChannels; ++ch)
            offsetOutputs[ch] = outputs[ch] + index;

        if (!fVintage)
            runAtNormalRate(offsetInputs, offsetOutputs, bs);
        else
            runDownsampled(offsetInputs, offsetOutputs, bs);

        index += bs;
    }

    ///
    if (fWet.getCurrentValue() == fWet.getTarget()) {
        float wet = fWet.getCurrentValue();
        for (uint32_t i = 0; i < frames; ++i) {
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] *= wet;
        }
    }
    else {
        for (uint32_t i = 0; i < frames; ++i) {
            float wet = fWet.next();
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] *= wet;
        }
    }

    ///
    if (fDry.getCurrentValue() == fDry.getTarget()) {
        float dry = fDry.getCurrentValue();
        for (uint32_t i = 0; i < frames; ++i) {
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] += dry * inputKeep[ch][i];
        }
    }
    else {
        for (uint32_t i = 0; i < frames; ++i) {
            float dry = fDry.next();
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] += dry * inputKeep[ch][i];
        }
    }
}